

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_se.c
# Opt level: O0

int h264_significant_coeff_flag
              (bitstream *str,h264_cabac_context *cabac,int field,int cat,int idx,int last,
              uint32_t *val)

{
  int iVar1;
  uint local_2c;
  int ctxIdx;
  int ctxInc;
  int last_local;
  int idx_local;
  int cat_local;
  int field_local;
  h264_cabac_context *cabac_local;
  bitstream *str_local;
  
  local_2c = idx;
  if (2 < (uint)cat) {
    if (cat == 3) {
      local_2c = (uint)idx / cabac->slice->chroma_array_type;
      if (2 < (int)local_2c) {
        local_2c = 2;
      }
    }
    else if (cat != 4) {
      if (cat != 5) {
        if (cat - 6U < 3) goto LAB_0010f76a;
        if (cat != 9) {
          if (cat - 10U < 3) goto LAB_0010f76a;
          if (cat != 0xd) {
            abort();
          }
        }
      }
      if (last == 0) {
        local_2c = h264_significant_coeff_flag::tab8x8[idx][field];
      }
      else {
        local_2c = h264_significant_coeff_flag::tab8x8[idx][2];
      }
    }
  }
LAB_0010f76a:
  iVar1 = h264_cabac_decision(str,cabac,
                              h264_significant_coeff_flag::basectx[last][field][cat] + local_2c,val)
  ;
  return iVar1;
}

Assistant:

int h264_significant_coeff_flag(struct bitstream *str, struct h264_cabac_context *cabac, int field, int cat, int idx, int last, uint32_t *val) {
	static const int basectx[2][2][14] = {
		{
			{
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT0,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT1,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT2,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT3,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT4,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT5,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT6,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT7,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT8,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT9,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT10,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT11,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT12,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FRAME_CAT13,
			},  {
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT0,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT1,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT2,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT3,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT4,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT5,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT6,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT7,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT8,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT9,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT10,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT11,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT12,
				H264_CABAC_CTXIDX_SIGNIFICANT_COEFF_FLAG_FIELD_CAT13,
			},
		}, {
			{
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT0,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT1,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT2,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT3,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT4,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT5,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT6,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT7,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT8,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT9,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT10,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT11,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT12,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FRAME_CAT13,
			},  {
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT0,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT1,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT2,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT3,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT4,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT5,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT6,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT7,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT8,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT9,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT10,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT11,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT12,
				H264_CABAC_CTXIDX_LAST_SIGNIFICANT_COEFF_FLAG_FIELD_CAT13,
			},
		},
	};
	static const int tab8x8[63][3] = {
		{  0,  0, 0 }, /*  0 */
		{  1,  1, 1 }, /*  1 */
		{  2,  1, 1 }, /*  2 */
		{  3,  2, 1 }, /*  3 */
		{  4,  2, 1 }, /*  4 */
		{  5,  3, 1 }, /*  5 */
		{  5,  3, 1 }, /*  6 */
		{  4,  4, 1 }, /*  7 */
		{  4,  5, 1 }, /*  8 */
		{  3,  6, 1 }, /*  9 */
		{  3,  7, 1 }, /* 10 */
		{  4,  7, 1 }, /* 11 */
		{  4,  7, 1 }, /* 12 */
		{  4,  8, 1 }, /* 13 */
		{  5,  4, 1 }, /* 14 */
		{  5,  5, 1 }, /* 15 */
		{  4,  6, 2 }, /* 16 */
		{  4,  9, 2 }, /* 17 */
		{  4, 10, 2 }, /* 18 */
		{  4, 10, 2 }, /* 19 */
		{  3,  8, 2 }, /* 20 */
		{  3, 11, 2 }, /* 21 */
		{  6, 12, 2 }, /* 22 */
		{  7, 11, 2 }, /* 23 */
		{  7,  9, 2 }, /* 24 */
		{  7,  9, 2 }, /* 25 */
		{  8, 10, 2 }, /* 26 */
		{  9, 10, 2 }, /* 27 */
		{ 10,  8, 2 }, /* 28 */
		{  9, 11, 2 }, /* 29 */
		{  8, 12, 2 }, /* 30 */
		{  7, 11, 2 }, /* 31 */
		{  7,  9, 3 }, /* 32 */
		{  6,  9, 3 }, /* 33 */
		{ 11, 10, 3 }, /* 34 */
		{ 12, 10, 3 }, /* 35 */
		{ 13,  8, 3 }, /* 36 */
		{ 11, 11, 3 }, /* 37 */
		{  6, 12, 3 }, /* 38 */
		{  7, 11, 3 }, /* 39 */
		{  8,  9, 4 }, /* 40 */
		{  9,  9, 4 }, /* 41 */
		{ 14, 10, 4 }, /* 42 */
		{ 10, 10, 4 }, /* 43 */
		{  9,  8, 4 }, /* 44 */
		{  8, 13, 4 }, /* 45 */
		{  6, 13, 4 }, /* 46 */
		{ 11,  9, 4 }, /* 47 */
		{ 12,  9, 5 }, /* 48 */
		{ 13, 10, 5 }, /* 49 */
		{ 11, 10, 5 }, /* 50 */
		{  6,  8, 5 }, /* 51 */
		{  9, 13, 6 }, /* 52 */
		{ 14, 13, 6 }, /* 53 */
		{ 10,  9, 6 }, /* 54 */
		{  9,  9, 6 }, /* 55 */
		{ 11, 10, 7 }, /* 56 */
		{ 12, 10, 7 }, /* 57 */
		{ 13, 14, 7 }, /* 58 */
		{ 11, 14, 7 }, /* 59 */
		{ 14, 14, 8 }, /* 60 */
		{ 10, 14, 8 }, /* 61 */
		{ 12, 14, 8 }, /* 62 */
	};
	int ctxInc;
	switch (cat) {
		case H264_CTXBLOCKCAT_LUMA_DC:
		case H264_CTXBLOCKCAT_LUMA_AC:
		case H264_CTXBLOCKCAT_LUMA_4X4:
		case H264_CTXBLOCKCAT_CB_DC:
		case H264_CTXBLOCKCAT_CB_AC:
		case H264_CTXBLOCKCAT_CB_4X4:
		case H264_CTXBLOCKCAT_CR_DC:
		case H264_CTXBLOCKCAT_CR_AC:
		case H264_CTXBLOCKCAT_CR_4X4:
		case H264_CTXBLOCKCAT_CHROMA_AC:
			ctxInc = idx;
			break;
		case H264_CTXBLOCKCAT_CHROMA_DC:
			ctxInc = idx / cabac->slice->chroma_array_type;
			if (ctxInc > 2)
				ctxInc = 2;
			break;
		case H264_CTXBLOCKCAT_LUMA_8X8:
		case H264_CTXBLOCKCAT_CB_8X8:
		case H264_CTXBLOCKCAT_CR_8X8:
			if (last)
				ctxInc = tab8x8[idx][2];
			else
				ctxInc = tab8x8[idx][field];
			break;
		default:
			abort();
	}
	int ctxIdx = basectx[last][field][cat] + ctxInc;
	return h264_cabac_decision(str, cabac, ctxIdx, val);
}